

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

void Prs_ManFree(Prs_Man_t *p)

{
  Prs_Man_t *p_local;
  
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  if (p->pFuns != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pFuns);
  }
  if (p->vHash != (Hash_IntMan_t *)0x0) {
    Hash_IntManDeref(p->vHash);
  }
  if (p->vNtks != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(p->vNtks);
  }
  Vec_StrErase(&p->vCover);
  Vec_IntErase(&p->vTemp);
  Vec_IntErase(&p->vTemp2);
  Vec_IntErase(&p->vTemp3);
  Vec_IntErase(&p->vTemp4);
  Vec_IntErase(&p->vKnown);
  Vec_IntErase(&p->vFailed);
  Vec_IntErase(&p->vSucceeded);
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  if (p != (Prs_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Prs_ManFree( Prs_Man_t * p )
{
    if ( p->pStrs ) Abc_NamDeref( p->pStrs );
    if ( p->pFuns ) Abc_NamDeref( p->pFuns );
    if ( p->vHash ) Hash_IntManDeref( p->vHash );
    if ( p->vNtks ) Prs_ManVecFree( p->vNtks );
    // temporary
    Vec_StrErase( &p->vCover );
    Vec_IntErase( &p->vTemp );
    Vec_IntErase( &p->vTemp2 );
    Vec_IntErase( &p->vTemp3 );
    Vec_IntErase( &p->vTemp4 );
    Vec_IntErase( &p->vKnown );
    Vec_IntErase( &p->vFailed );
    Vec_IntErase( &p->vSucceeded );
    ABC_FREE( p->pBuffer );
    ABC_FREE( p );
}